

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

void __thiscall
icu_63::CollationDataBuilder::build
          (CollationDataBuilder *this,CollationData *data,UErrorCode *errorCode)

{
  CollationData *pCVar1;
  
  buildMappings(this,data,errorCode);
  pCVar1 = this->base;
  if (pCVar1 != (CollationData *)0x0) {
    data->numericPrimary = pCVar1->numericPrimary;
    data->compressibleBytes = pCVar1->compressibleBytes;
    data->numScripts = pCVar1->numScripts;
    data->scriptsIndex = pCVar1->scriptsIndex;
    data->scriptStarts = pCVar1->scriptStarts;
    data->scriptStartsLength = pCVar1->scriptStartsLength;
  }
  buildFastLatinTable(this,data,errorCode);
  return;
}

Assistant:

void
CollationDataBuilder::build(CollationData &data, UErrorCode &errorCode) {
    buildMappings(data, errorCode);
    if(base != NULL) {
        data.numericPrimary = base->numericPrimary;
        data.compressibleBytes = base->compressibleBytes;
        data.numScripts = base->numScripts;
        data.scriptsIndex = base->scriptsIndex;
        data.scriptStarts = base->scriptStarts;
        data.scriptStartsLength = base->scriptStartsLength;
    }
    buildFastLatinTable(data, errorCode);
}